

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O0

void __thiscall
pstore::serialize::archive::writer_base<pstore::serialize::archive::details::null_policy>::put<int>
          (writer_base<pstore::serialize::archive::details::null_policy> *this,int *t)

{
  int *t_local;
  writer_base<pstore::serialize::archive::details::null_policy> *this_local;
  
  if ((this->flushed_ & 1U) == 0) {
    details::null_policy::put<int>((null_policy *)&this->field_0x8,t);
    this->bytes_consumed_ = this->bytes_consumed_ + 4;
    return;
  }
  assert_failed("!flushed_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                ,0xa3);
}

Assistant:

auto put (Ty const & t) -> result_type {
                    static_assert (std::is_standard_layout<Ty>::value,
                                   "writer_base can only write standard-layout types!");
                    PSTORE_ASSERT (!flushed_);
                    result_type r = policy_.put (t);
                    bytes_consumed_ += sizeof (t);
                    return r;
                }